

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MDLImporter::ValidateHeader_3DGS_MDL7(MDLImporter *this,Header_MDL7 *pcHeader)

{
  DeadlyImportError *pDVar1;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_9a;
  allocator<char> local_99;
  string local_98;
  undefined1 local_72;
  allocator<char> local_71;
  string local_70;
  undefined1 local_4d;
  allocator<char> local_39;
  string local_38;
  Header_MDL7 *local_18;
  Header_MDL7 *pcHeader_local;
  MDLImporter *this_local;
  
  local_18 = pcHeader;
  pcHeader_local = (Header_MDL7 *)this;
  if (pcHeader == (Header_MDL7 *)0x0) {
    __assert_fail("__null != pcHeader",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/MDL/MDLLoader.cpp"
                  ,0x35d,
                  "void Assimp::MDLImporter::ValidateHeader_3DGS_MDL7(const MDL::Header_MDL7 *)");
  }
  if (pcHeader->colorvalue_stc_size != 0x10) {
    local_4d = 1;
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,
               "[3DGS MDL7] sizeof(MDL::ColorValue_MDL7) != pcHeader->colorvalue_stc_size",&local_39
              );
    DeadlyImportError::DeadlyImportError(pDVar1,&local_38);
    local_4d = 0;
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if (pcHeader->skinpoint_stc_size != 8) {
    local_72 = 1;
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,
               "[3DGS MDL7] sizeof(MDL::TexCoord_MDL7) != pcHeader->skinpoint_stc_size",&local_71);
    DeadlyImportError::DeadlyImportError(pDVar1,&local_70);
    local_72 = 0;
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if (pcHeader->skin_stc_size != 0x1c) {
    local_9a = 1;
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"sizeof(MDL::Skin_MDL7) != pcHeader->skin_stc_size",&local_99);
    DeadlyImportError::DeadlyImportError(pDVar1,&local_98);
    local_9a = 0;
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if (pcHeader->groups_num == 0) {
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"[3DGS MDL7] No frames found",&local_c1);
    DeadlyImportError::DeadlyImportError(pDVar1,&local_c0);
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  return;
}

Assistant:

void MDLImporter::ValidateHeader_3DGS_MDL7(const MDL::Header_MDL7* pcHeader)
{
    ai_assert(NULL != pcHeader);

    // There are some fixed sizes ...
    if (sizeof(MDL::ColorValue_MDL7) != pcHeader->colorvalue_stc_size)  {
        throw DeadlyImportError(
            "[3DGS MDL7] sizeof(MDL::ColorValue_MDL7) != pcHeader->colorvalue_stc_size");
    }
    if (sizeof(MDL::TexCoord_MDL7) != pcHeader->skinpoint_stc_size) {
        throw DeadlyImportError(
            "[3DGS MDL7] sizeof(MDL::TexCoord_MDL7) != pcHeader->skinpoint_stc_size");
    }
    if (sizeof(MDL::Skin_MDL7) != pcHeader->skin_stc_size)  {
        throw DeadlyImportError(
            "sizeof(MDL::Skin_MDL7) != pcHeader->skin_stc_size");
    }

    // if there are no groups ... how should we load such a file?
    if(!pcHeader->groups_num)   {
        throw DeadlyImportError( "[3DGS MDL7] No frames found");
    }
}